

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu580.c
# Opt level: O0

MPP_RET hal_h265e_v580_wait(void *hal,HalEncTask *task)

{
  uint uVar1;
  RK_U32 hw_status_00;
  RK_U32 len;
  MppPacket pvVar2;
  undefined4 *param_00;
  MppBuffer buffer;
  uint *puVar3;
  RK_U32 *pRVar4;
  uint length;
  int iVar5;
  size_t sVar6;
  void *pvVar7;
  void *pvVar8;
  undefined4 local_10c;
  RK_U32 tile_size;
  RK_U32 hw_status;
  H265eV580StatusElem *elem_ret;
  RK_U32 i_1;
  RK_U32 offset_1;
  MppPacket pkt_1;
  RK_U32 type_1;
  hevc_vepu580_base *reg_base_1;
  H265eV580RegSet *regs_1;
  H265eV580StatusElem *elem;
  MppBuffer buf_1;
  void *tile1_ptr;
  MppBuffer buf;
  RK_S32 i;
  MppDevPollCfg *poll_cfg;
  RK_U32 type;
  hevc_vepu580_base *reg_base;
  H265eV580RegSet *regs;
  void *ptr;
  RK_U32 seg_offset;
  RK_U32 offset;
  MppPacket pkt;
  RK_U32 tile1_offset;
  RK_U32 finish_cnt;
  RK_U32 slice_last;
  RK_U32 slice_len;
  EncOutParam param;
  Vepu580H265eFrmCfg *frm;
  RK_S32 task_idx;
  RK_U32 split_out;
  HalEncTask *enc_task;
  H265eV580HalContext *ctx;
  MPP_RET ret;
  HalEncTask *task_local;
  void *hal_local;
  
  ctx._4_4_ = MPP_OK;
  frm._4_4_ = *(uint *)(*(long *)((long)hal + 200) + 0xe9c);
  param._16_8_ = *(undefined8 *)((long)hal + (long)(task->flags).reg_idx * 8 + 0x70);
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) enter\n",(char *)0x0,0xc85);
  }
  if ((task->flags).err == 0) {
    if (((task->rc_task->frm).val >> 2 & 1) != 0) {
      frm._4_4_ = 0;
    }
    if (frm._4_4_ == 0) {
      puVar3 = *(uint **)(param._16_8_ + 0x38);
      uVar1 = *(uint *)(*(long *)(param._16_8_ + 0x18) + 400);
      pvVar2 = task->packet;
      sVar6 = mpp_packet_get_length(pvVar2);
      elem_ret._4_4_ = (int)sVar6;
      if (*(int *)((long)hal + 0xec) == 0) {
        ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0x10,(void *)0x0);
      }
      else {
        for (elem_ret._0_4_ = 0; (uint)elem_ret < *(uint *)((long)hal + 0xe8);
            elem_ret._0_4_ = (uint)elem_ret + 1) {
          ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0x10,(void *)0x0);
        }
      }
      for (elem_ret._0_4_ = 0; (uint)elem_ret < *(uint *)((long)hal + 0xe8);
          elem_ret._0_4_ = (uint)elem_ret + 1) {
        pRVar4 = *(RK_U32 **)(param._16_8_ + 0x38 + (ulong)(uint)elem_ret * 8);
        hw_status_00 = *pRVar4;
        len = pRVar4[1];
        ctx._4_4_ = hal_h265e_vepu580_status_check(hw_status_00);
        if (ctx._4_4_ != MPP_OK) break;
        mpp_packet_add_segment_info(pvVar2,uVar1 & 0x3f,elem_ret._4_4_,len);
        elem_ret._4_4_ = len + elem_ret._4_4_;
        if ((*(int *)((long)hal + 0xf0) != 0) && ((hw_status_00 & 0xc0) != 0)) {
          dump_files((H265eV580HalContext *)hal,task);
          break;
        }
      }
      if (ctx._4_4_ != MPP_OK) {
        _mpp_log_l(2,"hal_h265e_v580","poll cmd failed %d status %d \n","hal_h265e_v580_wait",
                   (ulong)(uint)ctx._4_4_,(ulong)*puVar3);
      }
    }
    else {
      tile1_offset = 0;
      pkt._4_4_ = 0;
      pkt._0_4_ = 0;
      pvVar2 = task->packet;
      sVar6 = mpp_packet_get_length(pvVar2);
      pvVar7 = mpp_packet_get_pos(pvVar2);
      uVar1 = *(uint *)(*(long *)(param._16_8_ + 0x18) + 400);
      param_00 = *(undefined4 **)((long)hal + 0x140);
      _slice_last = task;
      param.task = mpp_packet_get_data(task->packet);
      ptr._0_4_ = (RK_U32)sVar6;
      do {
        while( true ) {
          *param_00 = 0;
          param_00[1] = 0;
          if ((frm._4_4_ & 1) == 0) {
            local_10c = *(undefined4 *)((long)hal + 0x88);
          }
          else {
            local_10c = 1;
          }
          param_00[2] = local_10c;
          param_00[3] = 0;
          ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0x10,param_00);
          for (buf._4_4_ = 0; buf._4_4_ < (int)param_00[3]; buf._4_4_ = buf._4_4_ + 1) {
            tile1_offset = -((int)param_00[(long)buf._4_4_ + 4] >> 0x1f);
            length = param_00[(long)buf._4_4_ + 4] & 0x7fffffff;
            param.base._4_4_ = length;
            if (pkt._4_4_ == 0) {
              mpp_buffer_sync_partial_begin_f
                        (task->output,1,(RK_U32)sVar6,length,"hal_h265e_v580_wait");
            }
            else {
              buffer = *(MppBuffer *)(param._16_8_ + 0x1b0 + (ulong)(pkt._4_4_ - 1) * 8);
              pvVar8 = mpp_buffer_get_ptr_with_caller(buffer,"hal_h265e_v580_wait");
              mpp_buffer_sync_partial_begin_f(buffer,1,(uint)pkt,length,"hal_h265e_v580_wait");
              memcpy((void *)((long)pvVar7 + (ulong)(RK_U32)ptr),
                     (void *)((long)pvVar8 + (ulong)(uint)pkt),(ulong)length);
              pkt._0_4_ = length + (uint)pkt;
            }
            *(undefined4 *)(*(long *)((long)hal + 0x148) + 0x10) = 0x202;
            iVar5 = pkt._4_4_;
            if (tile1_offset != 0) {
              iVar5 = pkt._4_4_ + 1;
              pkt._0_4_ = 0;
              if ((*(int *)((long)hal + 0xec) != 0) &&
                 (*(uint *)((long)hal + 0xe8) < pkt._4_4_ + 2U)) {
                *(undefined4 *)(*(long *)((long)hal + 0x148) + 0x10) = 0x201;
              }
            }
            pkt._4_4_ = iVar5;
            mpp_packet_add_segment_info(pvVar2,uVar1 & 0x3f,(RK_U32)ptr,length);
            if ((frm._4_4_ & 1) != 0) {
              mpp_callback_f("hal_h265e_v580_wait",*(MppCbCtx **)((long)hal + 0x148),&slice_last);
            }
            ptr._0_4_ = length + (RK_U32)ptr;
          }
          if (*(int *)((long)hal + 0xec) == 0) break;
          if (*(uint *)((long)hal + 0xe8) < pkt._4_4_ + 1U) goto LAB_00313e59;
        }
      } while (tile1_offset == 0);
    }
LAB_00313e59:
    if ((hal_h265e_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h265e_v580","(%d) leave\n",(char *)0x0,0xcff);
    }
    hal_local._4_4_ = ctx._4_4_;
  }
  else {
    _mpp_log_l(2,"hal_h265e_v580","enc_task->flags.err %08x, return early","hal_h265e_v580_wait",
               (ulong)(task->flags).err);
    hal_local._4_4_ = MPP_NOK;
  }
  return hal_local._4_4_;
}

Assistant:

MPP_RET hal_h265e_v580_wait(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    H265eV580HalContext *ctx = (H265eV580HalContext *)hal;
    HalEncTask *enc_task = task;
    RK_U32 split_out = ctx->cfg->split.split_out;
    RK_S32 task_idx = task->flags.reg_idx;
    Vepu580H265eFrmCfg *frm = ctx->frms[task_idx];

    hal_h265e_enter();

    if (enc_task->flags.err) {
        hal_h265e_err("enc_task->flags.err %08x, return early",
                      enc_task->flags.err);
        return MPP_NOK;
    }

    /* if pass1 mode, it will disable split mode and the split out need to be disable */
    if (enc_task->rc_task->frm.save_pass1)
        split_out = 0;

    if (split_out) {
        EncOutParam param;
        RK_U32 slice_len = 0;
        RK_U32 slice_last = 0;
        RK_U32 finish_cnt = 0;
        RK_U32 tile1_offset = 0;
        MppPacket pkt = enc_task->packet;
        RK_U32 offset = mpp_packet_get_length(pkt);
        RK_U32 seg_offset = offset;
        void* ptr = mpp_packet_get_pos(pkt);
        H265eV580RegSet *regs = frm->regs_set[0];
        hevc_vepu580_base *reg_base = &regs->reg_base;
        RK_U32 type = reg_base->reg0236_synt_nal.nal_unit_type;
        MppDevPollCfg *poll_cfg = (MppDevPollCfg *)((char *)ctx->poll_cfgs);

        param.task = task;
        param.base = mpp_packet_get_data(task->packet);

        do {
            RK_S32 i = 0;
            poll_cfg->poll_type = 0;
            poll_cfg->poll_ret  = 0;
            poll_cfg->count_max = split_out & MPP_ENC_SPLIT_OUT_LOWDELAY ? 1 : ctx->poll_slice_max;
            poll_cfg->count_ret = 0;

            ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, poll_cfg);

            for (i = 0; i < poll_cfg->count_ret; i++) {
                slice_last = poll_cfg->slice_info[i].last;
                slice_len = poll_cfg->slice_info[i].length;
                param.length = slice_len;

                if (finish_cnt > 0) {
                    MppBuffer buf = frm->hw_tile_stream[finish_cnt - 1];
                    void *tile1_ptr  = mpp_buffer_get_ptr(buf);

                    mpp_buffer_sync_ro_partial_begin(buf, tile1_offset, slice_len);
                    memcpy(ptr + seg_offset, tile1_ptr + tile1_offset, slice_len);
                    tile1_offset += slice_len;
                } else {
                    MppBuffer buf = enc_task->output;

                    mpp_buffer_sync_ro_partial_begin(buf, offset, slice_len);
                }

                ctx->output_cb->cmd = ENC_OUTPUT_SLICE;
                if (slice_last) {
                    finish_cnt++;
                    tile1_offset = 0;
                    if (ctx->tile_parall_en) {
                        if (finish_cnt + 1 > ctx->tile_num) {
                            ctx->output_cb->cmd = ENC_OUTPUT_FINISH;
                        }
                    }
                }

                mpp_packet_add_segment_info(pkt, type, seg_offset, slice_len);

                if (split_out & MPP_ENC_SPLIT_OUT_LOWDELAY)
                    mpp_callback(ctx->output_cb, &param);

                seg_offset += slice_len;
            }

            if (ctx->tile_parall_en) {
                if (finish_cnt + 1 > ctx->tile_num) {
                    break;
                }
            } else if (slice_last) {
                break;
            }
        } while (1);
    } else {
        H265eV580StatusElem *elem = frm->regs_ret[0];
        H265eV580RegSet *regs = frm->regs_set[0];
        hevc_vepu580_base *reg_base = &regs->reg_base;
        RK_U32 type = reg_base->reg0236_synt_nal.nal_unit_type;
        MppPacket pkt = enc_task->packet;
        RK_U32 offset = mpp_packet_get_length(pkt);
        RK_U32 i = 0;

        if (ctx->tile_parall_en) {
            for (i = 0; i < ctx->tile_num; i ++)
                ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
        } else {
            ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
        }

        for (i = 0; i < ctx->tile_num; i++) {
            H265eV580StatusElem *elem_ret = frm->regs_ret[i];
            RK_U32 hw_status = elem_ret->hw_status;
            RK_U32 tile_size = elem_ret->st.bs_lgth_l32;

            ret = hal_h265e_vepu580_status_check(hw_status);
            if (ret)
                break;
            mpp_packet_add_segment_info(pkt, type, offset, tile_size);
            offset += tile_size;

            if (ctx->tile_dump_err &&
                (hw_status & (RKV_ENC_INT_BUS_WRITE_ERROR | RKV_ENC_INT_BUS_READ_ERROR))) {
                dump_files(ctx, enc_task);
                break;
            }
        }

        if (ret)
            mpp_err_f("poll cmd failed %d status %d \n", ret, elem->hw_status);
    }

    hal_h265e_leave();

    return ret;
}